

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefCast
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          RefCast *curr)

{
  Literal *pLVar1;
  Literal local_a8;
  Literal *local_90;
  Literal *result;
  Flow *local_78;
  Flow *breaking;
  Cast cast;
  RefCast *curr_local;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  
  cast.state.
  super__Variant_base<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
  .
  super__Move_assign_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
  .
  super__Copy_assign_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
  .
  super__Move_ctor_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
  .
  super__Copy_ctor_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
  .
  super__Variant_storage_alias<wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Breaking,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Success,_wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::Cast::Failure>
  ._72_8_ = curr;
  doCast<wasm::RefCast>((Cast *)&breaking,this,curr);
  local_78 = Cast::getBreaking((Cast *)&breaking);
  if (local_78 == (Flow *)0x0) {
    local_90 = Cast::getSuccess((Cast *)&breaking);
    if (local_90 == (Literal *)0x0) {
      pLVar1 = Cast::getFailure((Cast *)&breaking);
      if (pLVar1 != (Literal *)0x0) {
        (*this->_vptr_ExpressionRunner[2])(this,"cast error");
        handle_unreachable("unreachable",
                           "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                           ,0x5c7);
      }
      __assert_fail("cast.getFailure()",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                    ,0x5c5,
                    "Flow wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visitRefCast(RefCast *) [SubType = wasm::PrecomputingExpressionRunner]"
                   );
    }
    wasm::Literal::Literal(&local_a8,local_90);
    Flow::Flow(__return_storage_ptr__,&local_a8);
    wasm::Literal::~Literal(&local_a8);
  }
  else {
    Flow::Flow(__return_storage_ptr__,local_78);
  }
  result._0_4_ = 1;
  Cast::~Cast((Cast *)&breaking);
  return __return_storage_ptr__;
}

Assistant:

Flow visitRefCast(RefCast* curr) {
    NOTE_ENTER("RefCast");
    auto cast = doCast(curr);
    if (auto* breaking = cast.getBreaking()) {
      return *breaking;
    } else if (auto* result = cast.getSuccess()) {
      return *result;
    }
    assert(cast.getFailure());
    trap("cast error");
    WASM_UNREACHABLE("unreachable");
  }